

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::get_primitive_triangle
          (TrimeshPrimitiveManager *this,int prim_index,cbtPrimitiveTriangle *triangle)

{
  uint indices [3];
  uint local_24;
  uint local_20;
  uint local_1c;
  
  get_indices(this,prim_index,&local_24,&local_20,&local_1c);
  get_vertex(this,local_24,triangle->m_vertices);
  get_vertex(this,local_20,triangle->m_vertices + 1);
  get_vertex(this,local_1c,triangle->m_vertices + 2);
  triangle->m_margin = this->m_margin;
  return;
}

Assistant:

virtual void get_primitive_triangle(int prim_index, cbtPrimitiveTriangle& triangle) const
		{
			unsigned int indices[3];
			get_indices(prim_index, indices[0], indices[1], indices[2]);
			get_vertex(indices[0], triangle.m_vertices[0]);
			get_vertex(indices[1], triangle.m_vertices[1]);
			get_vertex(indices[2], triangle.m_vertices[2]);
			triangle.m_margin = m_margin;
		}